

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_9uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined4 uVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ushort uVar21;
  byte bVar24;
  byte bVar25;
  undefined1 auVar22 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [16];
  byte bVar23;
  
  for (uVar19 = 0; uVar19 < (length & 0xfffffffffffffff8); uVar19 = uVar19 + 8) {
    bVar1 = *pSrc;
    bVar2 = pSrc[1];
    bVar3 = pSrc[2];
    bVar4 = pSrc[3];
    uVar6 = *(undefined4 *)(pSrc + 4);
    bVar5 = pSrc[8];
    pSrc = pSrc + 9;
    bVar25 = (byte)((uint)uVar6 >> 0x18);
    bVar24 = (byte)((uint)uVar6 >> 0x10);
    bVar23 = (byte)((uint)uVar6 >> 8);
    uVar21 = (ushort)uVar6 & 0xff;
    pDst[uVar19] = (uint)(bVar2 >> 7) + (uint)bVar1 * 2;
    pDst[uVar19 + 1] = (uint)(bVar3 >> 6) + (bVar2 & 0x7f) * 4;
    pDst[uVar19 + 2] = (uint)(bVar4 >> 5) + (bVar3 & 0x3f) * 8;
    pDst[uVar19 + 3] = (uint)(uVar21 >> 4) | (bVar4 & 0x1f) << 4;
    auVar22._0_2_ = uVar21 * 0x20;
    auVar22._2_2_ = (ushort)bVar23 * 0x40;
    auVar22._4_2_ = (ushort)bVar24 * 0x80;
    auVar22._6_2_ = (ushort)bVar25 * 0x100;
    auVar22._8_6_ = 0;
    auVar26._8_6_ = 0;
    auVar26._0_8_ =
         (ulong)(bVar23 >> 3) | (ulong)(bVar24 >> 2) << 0x10 | (ulong)(bVar25 >> 1) << 0x20 |
         (ulong)bVar5 << 0x30;
    auVar26 = auVar26 | auVar22 & SUB1614(ZEXT816(0x100018001c001e0),0);
    auVar7._10_2_ = 0;
    auVar7._0_10_ = auVar26._0_10_;
    auVar7._12_2_ = auVar26._6_2_;
    auVar9._2_4_ = auVar7._10_4_;
    auVar9._0_2_ = auVar26._4_2_;
    auVar9._6_8_ = 0;
    auVar8._4_2_ = auVar26._2_2_;
    auVar8._0_4_ = auVar26._0_4_;
    auVar8._6_8_ = SUB148(auVar9 << 0x40,6);
    auVar27._0_4_ = auVar26._0_4_ & 0xffff;
    auVar27._4_10_ = auVar8._4_10_;
    auVar27._14_2_ = 0;
    *(undefined1 (*) [16])(pDst + uVar19 + 4) = auVar27;
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar19] = (uint)(bVar1 >> 7) + (uint)*pSrc * 2;
    uVar18 = (uint)(length & 7);
    if (uVar18 != 1) {
      pbVar15 = pSrc + 2;
      uVar13 = 0;
      uVar20 = 7;
      uVar14 = 9;
      while( true ) {
        uVar12 = (uint)bVar1;
        uVar16 = uVar14 - uVar20;
        if (uVar14 < uVar20 || uVar16 == 0) break;
        uVar13 = (uVar13 | uVar12 & ~(-1 << (sbyte)uVar20)) << ((byte)uVar16 & 0x1f);
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        uVar20 = 8;
        uVar14 = uVar16;
      }
      iVar10 = uVar20 - uVar14;
      pDst[uVar19 + 1] =
           ~(-1 << ((byte)uVar14 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar10 & 0x1f)) | uVar13;
      if (2 < uVar18) {
        uVar14 = 0;
        iVar11 = 9;
        iVar17 = 9;
        if (iVar10 != 0) goto LAB_0010e8c0;
        while( true ) {
          iVar11 = iVar17;
          uVar12 = (uint)*pbVar15;
          pbVar15 = pbVar15 + 1;
          iVar10 = 8;
LAB_0010e8c0:
          iVar17 = iVar11 - iVar10;
          if (iVar17 == 0 || iVar11 < iVar10) break;
          uVar14 = (uVar14 | uVar12 & ~(-1 << ((byte)iVar10 & 0x1f))) << ((byte)iVar17 & 0x1f);
        }
        iVar10 = iVar10 - iVar11;
        pDst[uVar19 + 2] = ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12 >> ((byte)iVar10 & 0x1f) | uVar14
        ;
        if (uVar18 != 3) {
          uVar14 = 0;
          iVar11 = 9;
          iVar17 = 9;
          if (iVar10 != 0) goto LAB_0010e924;
          while( true ) {
            iVar11 = iVar17;
            uVar12 = (uint)*pbVar15;
            pbVar15 = pbVar15 + 1;
            iVar10 = 8;
LAB_0010e924:
            iVar17 = iVar11 - iVar10;
            if (iVar17 == 0 || iVar11 < iVar10) break;
            uVar14 = (uVar14 | uVar12 & ~(-1 << ((byte)iVar10 & 0x1f))) << ((byte)iVar17 & 0x1f);
          }
          iVar10 = iVar10 - iVar11;
          pDst[uVar19 + 3] =
               ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12 >> ((byte)iVar10 & 0x1f) | uVar14;
          if (4 < uVar18) {
            uVar14 = 0;
            iVar11 = 9;
            iVar17 = 9;
            if (iVar10 != 0) goto LAB_0010e988;
            while( true ) {
              iVar11 = iVar17;
              uVar12 = (uint)*pbVar15;
              pbVar15 = pbVar15 + 1;
              iVar10 = 8;
LAB_0010e988:
              iVar17 = iVar11 - iVar10;
              if (iVar17 == 0 || iVar11 < iVar10) break;
              uVar14 = (uVar14 | uVar12 & ~(-1 << ((byte)iVar10 & 0x1f))) << ((byte)iVar17 & 0x1f);
            }
            iVar10 = iVar10 - iVar11;
            pDst[uVar19 + 4] =
                 ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12 >> ((byte)iVar10 & 0x1f) | uVar14;
            if (uVar18 != 5) {
              uVar14 = 0;
              iVar11 = 9;
              iVar17 = 9;
              if (iVar10 != 0) goto LAB_0010e9ec;
              while( true ) {
                iVar11 = iVar17;
                uVar12 = (uint)*pbVar15;
                pbVar15 = pbVar15 + 1;
                iVar10 = 8;
LAB_0010e9ec:
                iVar17 = iVar11 - iVar10;
                if (iVar17 == 0 || iVar11 < iVar10) break;
                uVar14 = (uVar14 | uVar12 & ~(-1 << ((byte)iVar10 & 0x1f))) << ((byte)iVar17 & 0x1f)
                ;
              }
              iVar10 = iVar10 - iVar11;
              pDst[uVar19 + 5] =
                   ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12 >> ((byte)iVar10 & 0x1f) | uVar14;
              if (uVar18 == 7) {
                uVar18 = 0;
                iVar11 = 9;
                iVar17 = 9;
                if (iVar10 != 0) goto LAB_0010ea4c;
                while( true ) {
                  iVar11 = iVar17;
                  uVar12 = (uint)*pbVar15;
                  pbVar15 = pbVar15 + 1;
                  iVar10 = 8;
LAB_0010ea4c:
                  iVar17 = iVar11 - iVar10;
                  if (iVar17 == 0 || iVar11 < iVar10) break;
                  uVar18 = (uVar18 | uVar12 & ~(-1 << ((byte)iVar10 & 0x1f))) <<
                           ((byte)iVar17 & 0x1f);
                }
                pDst[uVar19 + 6] =
                     ~(-1 << ((byte)iVar11 & 0x1f)) & uVar12 >> ((byte)iVar10 - (byte)iVar11 & 0x1f)
                     | uVar18;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_9uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 1) | (val1 >> 7));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7FU) << 2) | (val2 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0x3FU) << 3) | (val3 >> 5));
        pDst[i + 3] = (OPJ_INT32)(((val3 & 0x1FU) << 4) | (val4 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val4 & 0xFU) << 5) | (val5 >> 3));
        pDst[i + 5] = (OPJ_INT32)(((val5 & 0x7U) << 6) | (val6 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val6 & 0x3U) << 7) | (val7 >> 1));
        pDst[i + 7] = (OPJ_INT32)(((val7 & 0x1U) << 8) | (val8));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 9)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 9)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 9)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 9)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 9)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 9)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 9)
                            }
                        }
                    }
                }
            }
        }
    }
}